

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall
QTreeViewPrivate::adjustViewOptionsForIndex
          (QTreeViewPrivate *this,QStyleOptionViewItem *option,QModelIndex *current)

{
  long lVar1;
  QFlagsStorageHelper<QStyle::StateFlag,_4> QVar2;
  int iVar3;
  const_reference pQVar4;
  const_reference pVVar5;
  QModelIndex *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int visualIndex;
  int right;
  int left;
  bool spanning;
  int row;
  QList<QStyleOptionViewItem::ViewItemPosition> viewItemPosList;
  QList<int> logicalIndices;
  qsizetype in_stack_ffffffffffffff58;
  int *t;
  QHeaderView *in_stack_ffffffffffffff60;
  QListSpecialMethodsBase<int> *this_00;
  byte local_7d;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  QModelIndex *in_stack_ffffffffffffffb8;
  undefined1 *puVar6;
  QTreeViewPrivate *in_stack_ffffffffffffffc0;
  QList<QStyleOptionViewItem::ViewItemPosition> *itemPositions;
  QList<int> *logicalIndices_00;
  QTreeViewPrivate *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  viewIndex(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  QList<QTreeViewItem>::at
            ((QList<QTreeViewItem> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  QFlags<QStyle::StateFlag>::operator|
            ((QFlags<QStyle::StateFlag> *)in_stack_ffffffffffffff60,
             (StateFlag)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  QList<QTreeViewItem>::at
            ((QList<QTreeViewItem> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  QFlags<QStyle::StateFlag>::operator|
            ((QFlags<QStyle::StateFlag> *)in_stack_ffffffffffffff60,
             (StateFlag)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  QList<QTreeViewItem>::at
            ((QList<QTreeViewItem> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  QVar2.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator|
                 ((QFlags<QStyle::StateFlag> *)in_stack_ffffffffffffff60,
                  (StateFlag)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  ((QFlagsStorageHelper<QStyle::StateFlag,_4> *)(in_RSI + 8))->
  super_QFlagsStorage<QStyle::StateFlag> = QVar2.super_QFlagsStorage<QStyle::StateFlag>.i;
  local_7d = 1;
  if ((*(uint *)(in_RDI + 0x33c) & 1) == 0) {
    local_7d = *(byte *)(in_RSI + 0x68);
  }
  *(byte *)(in_RSI + 0x68) = local_7d & 1;
  this_01 = (QTreeViewPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0x8f6432);
  puVar6 = &DAT_aaaaaaaaaaaaaaaa;
  itemPositions = (QList<QStyleOptionViewItem::ViewItemPosition> *)&DAT_aaaaaaaaaaaaaaaa;
  logicalIndices_00 = (QList<int> *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QStyleOptionViewItem::ViewItemPosition>::QList
            ((QList<QStyleOptionViewItem::ViewItemPosition> *)0x8f6460);
  pQVar4 = QList<QTreeViewItem>::at
                     ((QList<QTreeViewItem> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if ((*(ulong *)&pQVar4->field_0x1c >> 1 & 1) == 0) {
    QHeaderView::count(in_stack_ffffffffffffff60);
  }
  else {
    iVar3 = QHeaderView::visualIndex
                      ((QHeaderView *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       in_stack_ffffffffffffff84);
    QHeaderView::visualIndex
              ((QHeaderView *)CONCAT44(iVar3,in_stack_ffffffffffffff88),in_stack_ffffffffffffff84);
  }
  this_00 = (QListSpecialMethodsBase<int> *)&stack0xffffffffffffffd0;
  t = (int *)&stack0xffffffffffffffb8;
  calcLogicalIndices(this_01,logicalIndices_00,itemPositions,(int)((ulong)puVar6 >> 0x20),
                     (int)puVar6);
  QModelIndex::column(in_RDX);
  QListSpecialMethodsBase<int>::indexOf<int>(this_00,t,0x8f6544);
  pVVar5 = QList<QStyleOptionViewItem::ViewItemPosition>::at
                     ((QList<QStyleOptionViewItem::ViewItemPosition> *)this_00,(qsizetype)t);
  *(ViewItemPosition *)(in_RSI + 0xc0) = *pVVar5;
  QList<QStyleOptionViewItem::ViewItemPosition>::~QList
            ((QList<QStyleOptionViewItem::ViewItemPosition> *)0x8f656c);
  QList<int>::~QList((QList<int> *)0x8f6576);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeViewPrivate::adjustViewOptionsForIndex(QStyleOptionViewItem *option, const QModelIndex &current) const
{
    const int row = viewIndex(current); // get the index in viewItems[]
    option->state = option->state | (viewItems.at(row).expanded ? QStyle::State_Open : QStyle::State_None)
                                  | (viewItems.at(row).hasChildren ? QStyle::State_Children : QStyle::State_None)
                                  | (viewItems.at(row).hasMoreSiblings ? QStyle::State_Sibling : QStyle::State_None);

    option->showDecorationSelected = (selectionBehavior & QTreeView::SelectRows)
                                     || option->showDecorationSelected;

    QList<int>
            logicalIndices; // index = visual index of visible columns only. data = logical index.
    QList<QStyleOptionViewItem::ViewItemPosition>
            viewItemPosList; // vector of left/middle/end for each logicalIndex, visible columns
                             // only.
    const bool spanning = viewItems.at(row).spanning;
    const int left = (spanning ? header->visualIndex(0) : 0);
    const int right = (spanning ? header->visualIndex(0) : header->count() - 1 );
    calcLogicalIndices(&logicalIndices, &viewItemPosList, left, right);

    const int visualIndex = logicalIndices.indexOf(current.column());
    option->viewItemPosition = viewItemPosList.at(visualIndex);
}